

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O2

void __thiscall xray_re::xr_way_object::save(xr_way_object *this,xr_writer *w)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,1,&WAYOBJECT_VERSION);
  xr_writer::open_chunk(w,2);
  uStack_28._0_6_ =
       CONCAT24((short)(((long)(this->m_points).
                               super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_points).
                              super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x38),
                (undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,2);
  xr_writer::
  w_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_le>
            (w,&this->m_points);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,3);
  uStack_28 = CONCAT26((short)((uint)(*(int *)&(this->m_links).
                                               super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                     *(int *)&(this->m_links).
                                              super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3),
                       (undefined6)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 6,2);
  xr_writer::
  w_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
            (w,&this->m_links);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<unsigned_int>(w,4,&this->m_type);
  return;
}

Assistant:

void xr_way_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, WAYOBJECT_VERSION);

	w.open_chunk(WAYOBJECT_CHUNK_POINTS);
	w.w_size_u16(m_points.size());
	w.w_seq(m_points, write_point_le());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_LINKS);
	w.w_size_u16(m_links.size());
	w.w_seq(m_links, way_link_io());
	w.close_chunk();

	w.w_chunk<uint32_t>(WAYOBJECT_CHUNK_TYPE, m_type);
}